

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementUtilities.cpp
# Opt level: O0

bool Rml::ElementUtilities::SetClippingRegion(Element *element,bool force_clip_self)

{
  pointer *this;
  Rectanglei new_region;
  Context *this_00;
  RenderManager *this_01;
  vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> local_a0;
  pointer local_88;
  undefined1 local_59;
  undefined1 local_58 [7];
  bool scissoring_enabled;
  ClipMaskGeometryList clip_mask_list;
  Rectanglei clip_region;
  RenderManager *render_manager;
  Context *context;
  bool force_clip_self_local;
  Element *element_local;
  
  this_00 = Element::GetContext(element);
  if (this_00 == (Context *)0x0) {
    element_local._7_1_ = false;
  }
  else {
    this_01 = Context::GetRenderManager(this_00);
    this = &clip_mask_list.
            super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    Rectangle<int>::Rectangle((Rectangle<int> *)this);
    ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::vector
              ((vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> *)local_58);
    local_59 = GetClippingRegion(element,(Rectanglei *)this,
                                 (vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>
                                  *)local_58,force_clip_self);
    if ((bool)local_59) {
      local_88 = clip_mask_list.
                 super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      new_region.p1 = clip_region.p0;
      new_region.p0 =
           (Vector2Type)
           clip_mask_list.
           super__Vector_base<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
      RenderManager::SetScissorRegion(this_01,new_region);
    }
    else {
      RenderManager::DisableScissorRegion(this_01);
    }
    ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::vector
              (&local_a0,
               (vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> *)local_58);
    RenderManager::SetClipMask(this_01,&local_a0);
    ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::~vector(&local_a0)
    ;
    element_local._7_1_ = true;
    ::std::vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_>::~vector
              ((vector<Rml::ClipMaskGeometry,_std::allocator<Rml::ClipMaskGeometry>_> *)local_58);
  }
  return element_local._7_1_;
}

Assistant:

bool ElementUtilities::SetClippingRegion(Element* element, bool force_clip_self)
{
	Context* context = element->GetContext();
	if (!context)
		return false;

	RenderManager& render_manager = context->GetRenderManager();

	Rectanglei clip_region;
	ClipMaskGeometryList clip_mask_list;

	const bool scissoring_enabled = GetClippingRegion(element, clip_region, &clip_mask_list, force_clip_self);
	if (scissoring_enabled)
		render_manager.SetScissorRegion(clip_region);
	else
		render_manager.DisableScissorRegion();

	render_manager.SetClipMask(std::move(clip_mask_list));

	return true;
}